

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

BasicBlock * __thiscall spvtools::opt::BasicBlock::Clone(BasicBlock *this,IRContext *context)

{
  bool bVar1;
  BasicBlock *pBVar2;
  Instruction *pIVar3;
  Instruction *inst_1;
  iterator __end3;
  iterator __begin3;
  BasicBlock *__range3;
  Instruction *local_48;
  Instruction *inst;
  const_iterator __end2;
  const_iterator __begin2;
  InstructionList *__range2;
  BasicBlock *local_20;
  BasicBlock *clone;
  IRContext *context_local;
  BasicBlock *this_local;
  
  clone = (BasicBlock *)context;
  context_local = (IRContext *)this;
  pBVar2 = (BasicBlock *)::operator_new(0x88);
  pIVar3 = GetLabelInst(this);
  pIVar3 = opt::Instruction::Clone(pIVar3,(IRContext *)clone);
  std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
  unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
            ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
              *)&__range2,pIVar3);
  BasicBlock(pBVar2,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&__range2);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               *)&__range2);
  local_20 = pBVar2;
  InstructionList::begin((InstructionList *)&__end2);
  InstructionList::end((InstructionList *)&inst);
  while (bVar1 = utils::operator!=(&__end2,(iterator_template<const_spvtools::opt::Instruction> *)
                                           &inst), bVar1) {
    local_48 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<const_spvtools::opt::Instruction>::operator*(&__end2);
    pBVar2 = local_20;
    pIVar3 = opt::Instruction::Clone(local_48,(IRContext *)clone);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&__range3,pIVar3);
    AddInstruction(pBVar2,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                           *)&__range3);
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 *)&__range3);
    utils::IntrusiveList<spvtools::opt::Instruction>::
    iterator_template<const_spvtools::opt::Instruction>::operator++(&__end2);
  }
  bVar1 = IRContext::AreAnalysesValid((IRContext *)clone,kAnalysisInstrToBlockMapping);
  if (bVar1) {
    begin((BasicBlock *)&__end3);
    end((BasicBlock *)&inst_1);
    while (bVar1 = utils::operator!=(&__end3.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&inst_1),
          bVar1) {
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*(&__end3.super_iterator);
      IRContext::set_instr_block((IRContext *)clone,pIVar3,local_20);
      InstructionList::iterator::operator++(&__end3);
    }
  }
  return local_20;
}

Assistant:

BasicBlock* BasicBlock::Clone(IRContext* context) const {
  BasicBlock* clone = new BasicBlock(
      std::unique_ptr<Instruction>(GetLabelInst()->Clone(context)));
  for (const auto& inst : insts_) {
    // Use the incoming context
    clone->AddInstruction(std::unique_ptr<Instruction>(inst.Clone(context)));
  }

  if (context->AreAnalysesValid(
          IRContext::Analysis::kAnalysisInstrToBlockMapping)) {
    for (auto& inst : *clone) {
      context->set_instr_block(&inst, clone);
    }
  }

  return clone;
}